

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_x86_avx512.cpp
# Opt level: O3

void __thiscall ncnn::Pooling_x86_avx512::create_pipeline(Pooling_x86_avx512 *this)

{
  _func_int *p_Var1;
  long lVar2;
  
  p_Var1 = this->_vptr_Pooling_x86_avx512[-6];
  lVar2 = *(long *)((long)&this->_vptr_Pooling_x86_avx512 + (long)p_Var1);
  if (*(int *)(&this->field_0x100 + (long)(p_Var1 + *(long *)(lVar2 + -0x18))) != 0) {
    (&this->field_0xb)[(long)(p_Var1 + *(long *)(lVar2 + -0x18))] = 0;
    (&this->field_0xc)[(long)(p_Var1 + *(long *)(lVar2 + -0x18))] = 0;
    (&this->field_0xd)[(long)(p_Var1 + *(long *)(lVar2 + -0x18))] = 0;
    (&this->field_0xe)[(long)(p_Var1 + *(long *)(lVar2 + -0x18))] = 0;
    (&this->field_0x10)[(long)(p_Var1 + *(long *)(lVar2 + -0x18))] = 0;
  }
  return;
}

Assistant:

int Pooling_x86_avx512::create_pipeline(const Option& /*opt*/)
{
    if (adaptive_pooling)
    {
        support_packing = false;

        support_bf16_storage = false;
        support_fp16_storage = false;
        support_int8_storage = false;
        support_tensor_storage = false;
    }
    return 0;
}